

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode resolve_server(Curl_easy *data,connectdata *conn,_Bool *async)

{
  int iVar1;
  timediff_t timeoutms;
  Curl_dns_entry *pCVar2;
  Curl_addrinfo *pCVar3;
  char *pcVar4;
  CURLcode CVar5;
  ulong uVar6;
  long lVar7;
  _Bool longpath;
  Curl_dns_entry *hostaddr;
  _Bool local_39;
  Curl_dns_entry *local_38;
  
  timeoutms = Curl_timeleft(data,(curltime *)0x0,true);
  if ((conn->bits).reuse == true) {
    *async = false;
    return CURLE_OK;
  }
  pcVar4 = conn->unix_domain_socket;
  if (pcVar4 == (char *)0x0) {
    if ((conn->bits).proxy == false) {
      lVar7 = 0xc0;
      if ((conn->bits).conn_to_host != false) {
        lVar7 = 0xf0;
      }
      conn->port = (long)*(int *)(conn->primary_ip + (ulong)(conn->bits).conn_to_port * 4 + -10);
      pcVar4 = (*Curl_cstrdup)(*(char **)((conn->chunk).hexbuffer + lVar7 + -0x10));
      conn->hostname_resolve = pcVar4;
      if (pcVar4 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      iVar1 = Curl_resolv_timeout(conn,pcVar4,(int)conn->port,&local_38,timeoutms);
      if (iVar1 == -2) goto LAB_0011d87f;
      if (iVar1 == 1) goto LAB_0011d833;
      if (local_38 == (Curl_dns_entry *)0x0) {
        Curl_failf(data,"Couldn\'t resolve host \'%s\'",
                   *(undefined8 *)((conn->chunk).hexbuffer + lVar7 + -8));
        CVar5 = CURLE_COULDNT_RESOLVE_HOST;
        goto LAB_0011d892;
      }
    }
    else {
      uVar6 = (ulong)(((conn->bits).socksproxy ^ 1) << 6);
      pcVar4 = (*Curl_cstrdup)(*(char **)((long)&(conn->socks_proxy).host.name + uVar6));
      conn->hostname_resolve = pcVar4;
      if (pcVar4 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      iVar1 = Curl_resolv_timeout(conn,pcVar4,(int)conn->port,&local_38,timeoutms);
      if (iVar1 == -2) {
LAB_0011d87f:
        CVar5 = CURLE_OPERATION_TIMEDOUT;
        goto LAB_0011d892;
      }
      if (iVar1 == 1) {
LAB_0011d833:
        *async = true;
      }
      else if (local_38 == (Curl_dns_entry *)0x0) {
        Curl_failf(data,"Couldn\'t resolve proxy \'%s\'",
                   *(undefined8 *)((conn->chunk).hexbuffer + ((uVar6 | 0x110) - 8)));
        CVar5 = CURLE_COULDNT_RESOLVE_PROXY;
        goto LAB_0011d892;
      }
    }
  }
  else {
    pCVar2 = (Curl_dns_entry *)(*Curl_ccalloc)(1,0x18);
    local_38 = pCVar2;
    if (pCVar2 == (Curl_dns_entry *)0x0) {
      CVar5 = CURLE_OUT_OF_MEMORY;
      goto LAB_0011d892;
    }
    local_39 = false;
    pCVar3 = Curl_unix2addr(pcVar4,&local_39,conn->abstract_unix_socket);
    pCVar2->addr = pCVar3;
    if (pCVar3 == (Curl_addrinfo *)0x0) {
      CVar5 = CURLE_OUT_OF_MEMORY;
      if (local_39 == true) {
        Curl_failf(data,"Unix socket path too long: \'%s\'",pcVar4);
        CVar5 = CURLE_COULDNT_RESOLVE_HOST;
      }
      (*Curl_cfree)(pCVar2);
      local_38 = (Curl_dns_entry *)0x0;
      goto LAB_0011d892;
    }
    pCVar2->inuse = pCVar2->inuse + 1;
  }
  CVar5 = CURLE_OK;
LAB_0011d892:
  conn->dns_entry = local_38;
  return CVar5;
}

Assistant:

static CURLcode resolve_server(struct Curl_easy *data,
                               struct connectdata *conn,
                               bool *async)
{
  CURLcode result = CURLE_OK;
  timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

  /*************************************************************
   * Resolve the name of the server or proxy
   *************************************************************/
  if(conn->bits.reuse)
    /* We're reusing the connection - no need to resolve anything, and
       idnconvert_hostname() was called already in create_conn() for the re-use
       case. */
    *async = FALSE;

  else {
    /* this is a fresh connect */
    int rc;
    struct Curl_dns_entry *hostaddr;

#ifdef USE_UNIX_SOCKETS
    if(conn->unix_domain_socket) {
      /* Unix domain sockets are local. The host gets ignored, just use the
       * specified domain socket address. Do not cache "DNS entries". There is
       * no DNS involved and we already have the filesystem path available */
      const char *path = conn->unix_domain_socket;

      hostaddr = calloc(1, sizeof(struct Curl_dns_entry));
      if(!hostaddr)
        result = CURLE_OUT_OF_MEMORY;
      else {
        bool longpath = FALSE;
        hostaddr->addr = Curl_unix2addr(path, &longpath,
                                        conn->abstract_unix_socket);
        if(hostaddr->addr)
          hostaddr->inuse++;
        else {
          /* Long paths are not supported for now */
          if(longpath) {
            failf(data, "Unix socket path too long: '%s'", path);
            result = CURLE_COULDNT_RESOLVE_HOST;
          }
          else
            result = CURLE_OUT_OF_MEMORY;
          free(hostaddr);
          hostaddr = NULL;
        }
      }
    }
    else
#endif
    if(!conn->bits.proxy) {
      struct hostname *connhost;
      if(conn->bits.conn_to_host)
        connhost = &conn->conn_to_host;
      else
        connhost = &conn->host;

      /* If not connecting via a proxy, extract the port from the URL, if it is
       * there, thus overriding any defaults that might have been set above. */
      if(conn->bits.conn_to_port)
        conn->port = conn->conn_to_port;
      else
        conn->port = conn->remote_port;

      /* Resolve target host right on */
      conn->hostname_resolve = strdup(connhost->name);
      if(!conn->hostname_resolve)
        return CURLE_OUT_OF_MEMORY;
      rc = Curl_resolv_timeout(conn, conn->hostname_resolve, (int)conn->port,
                               &hostaddr, timeout_ms);
      if(rc == CURLRESOLV_PENDING)
        *async = TRUE;

      else if(rc == CURLRESOLV_TIMEDOUT)
        result = CURLE_OPERATION_TIMEDOUT;

      else if(!hostaddr) {
        failf(data, "Couldn't resolve host '%s'", connhost->dispname);
        result =  CURLE_COULDNT_RESOLVE_HOST;
        /* don't return yet, we need to clean up the timeout first */
      }
    }
    else {
      /* This is a proxy that hasn't been resolved yet. */

      struct hostname * const host = conn->bits.socksproxy ?
        &conn->socks_proxy.host : &conn->http_proxy.host;

      /* resolve proxy */
      conn->hostname_resolve = strdup(host->name);
      if(!conn->hostname_resolve)
        return CURLE_OUT_OF_MEMORY;
      rc = Curl_resolv_timeout(conn, conn->hostname_resolve, (int)conn->port,
                               &hostaddr, timeout_ms);

      if(rc == CURLRESOLV_PENDING)
        *async = TRUE;

      else if(rc == CURLRESOLV_TIMEDOUT)
        result = CURLE_OPERATION_TIMEDOUT;

      else if(!hostaddr) {
        failf(data, "Couldn't resolve proxy '%s'", host->dispname);
        result = CURLE_COULDNT_RESOLVE_PROXY;
        /* don't return yet, we need to clean up the timeout first */
      }
    }
    DEBUGASSERT(conn->dns_entry == NULL);
    conn->dns_entry = hostaddr;
  }

  return result;
}